

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::EnergyScan
          (CommissionerImpl *this,ErrorHandler *aHandler,uint32_t aChannelMask,uint8_t aCount,
          uint16_t aPeriod,uint16_t aScanDuration,string *aDstAddr)

{
  type tVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined7 in_register_00000009;
  char *begin;
  undefined6 in_register_00000082;
  undefined6 in_register_0000008a;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar6;
  format_args args;
  Error error;
  Address dstAddr;
  ByteArray channelMask;
  anon_class_32_1_d0c21527 onResponse;
  Request request;
  undefined1 local_208 [8];
  uchar *local_200;
  char local_1f8 [8];
  uchar local_1f0 [16];
  type local_1e0;
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  size_t local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  parse_func local_190 [1];
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  Address local_178;
  ByteArray local_158;
  _Any_data local_140;
  code *local_130;
  _Any_data local_120;
  code *local_110;
  string local_100;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  char local_c8 [16];
  Message local_b8;
  
  aVar5._2_6_ = in_register_0000008a;
  aVar5._0_2_ = aScanDuration;
  local_1d8 = local_1c8;
  local_1e0 = 0;
  local_1d0 = 0;
  local_1c8[0] = 0;
  local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  aVar6 = aVar5;
  coap::Message::Message(&local_b8,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_120,aHandler);
  local_17c = (undefined4)CONCAT71(in_register_00000009,aCount);
  local_180 = (undefined4)CONCAT62(in_register_00000082,aPeriod);
  local_184 = aVar5._0_4_;
  Address::Set((Error *)local_1b8,&local_178,aDstAddr);
  local_1e0 = local_1b8._0_4_;
  std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_1b0);
  tVar1 = local_1e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_p != &local_1a0) {
    operator_delete(local_1b0._M_p);
  }
  if (tVar1 == none_type) {
    if ((local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (*local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start == 0xff)) {
      local_b8.mHeader._0_1_ = local_b8.mHeader._0_1_ & 0xf3 | 4;
    }
    iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
    if ((char)iVar2 == '\0') {
      local_1b8._0_4_ = none_type;
      local_1b0._M_p = "the commissioner is not active";
      local_1a8 = 0x1e;
      local_1a0._M_allocated_capacity = 0;
      local_190[0] = (parse_func)0x0;
      begin = "the commissioner is not active";
      local_1a0._8_8_ = (format_string_checker<char> *)local_1b8;
      do {
        pcVar3 = begin + 1;
        if (*begin == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (begin,"",(format_string_checker<char> *)local_1b8);
        }
        begin = pcVar3;
      } while (pcVar3 != "");
      args.field_1.args_ = aVar6.args_;
      args.desc_ = (unsigned_long_long)local_1b8;
      ::fmt::v10::vformat_abi_cxx11_(&local_100,(v10 *)0x2193cb,(string_view)ZEXT816(0x1e),args);
      local_208._0_4_ = 0xf;
      local_200 = local_1f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_200,local_100._M_dataplus._M_p,
                 local_100._M_dataplus._M_p + local_100._M_string_length);
      local_1e0 = local_208._0_4_;
      std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_200);
      if (local_200 != local_1f0) {
        operator_delete(local_200);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
    }
    else {
      local_208 = (undefined1  [8])local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"/c/es","");
      coap::Message::SetUriPath((Error *)local_1b8,&local_b8,(string *)local_208);
      local_1e0 = local_1b8._0_4_;
      std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_1b0);
      tVar1 = local_1e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_p != &local_1a0) {
        operator_delete(local_1b0._M_p);
      }
      if (local_208 != (undefined1  [8])local_1f8) {
        operator_delete((void *)local_208);
      }
      if (tVar1 == none_type) {
        iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[7])();
        tlv::Tlv::Tlv((Tlv *)local_208,kCommissionerSessionId,(uint16_t)iVar2,kMeshCoP);
        AppendTlv((Error *)local_1b8,&local_b8,(Tlv *)local_208);
        local_1e0 = local_1b8._0_4_;
        std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_1b0);
        tVar1 = local_1e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_p != &local_1a0) {
          operator_delete(local_1b0._M_p);
        }
        if (local_200 != (uchar *)0x0) {
          operator_delete(local_200);
        }
        if (tVar1 == none_type) {
          MakeChannelMask((Error *)local_1b8,&local_158,aChannelMask);
          local_1e0 = local_1b8._0_4_;
          std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_1b0);
          tVar1 = local_1e0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_p != &local_1a0) {
            operator_delete(local_1b0._M_p);
          }
          if (tVar1 == none_type) {
            tlv::Tlv::Tlv((Tlv *)local_208,kChannelMask,&local_158,kMeshCoP);
            AppendTlv((Error *)local_1b8,&local_b8,(Tlv *)local_208);
            local_1e0 = local_1b8._0_4_;
            std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_1b0);
            tVar1 = local_1e0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_p != &local_1a0) {
              operator_delete(local_1b0._M_p);
            }
            if (local_200 != (uchar *)0x0) {
              operator_delete(local_200);
            }
            if (tVar1 == none_type) {
              tlv::Tlv::Tlv((Tlv *)local_208,kCount,(uint8_t)local_17c,kMeshCoP);
              AppendTlv((Error *)local_1b8,&local_b8,(Tlv *)local_208);
              local_1e0 = local_1b8._0_4_;
              std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_1b0);
              tVar1 = local_1e0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_p != &local_1a0) {
                operator_delete(local_1b0._M_p);
              }
              if (local_200 != (uchar *)0x0) {
                operator_delete(local_200);
              }
              if (tVar1 == none_type) {
                tlv::Tlv::Tlv((Tlv *)local_208,kPeriod,(uint16_t)local_180,kMeshCoP);
                AppendTlv((Error *)local_1b8,&local_b8,(Tlv *)local_208);
                local_1e0 = local_1b8._0_4_;
                std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_1b0);
                tVar1 = local_1e0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_p != &local_1a0) {
                  operator_delete(local_1b0._M_p);
                }
                if (local_200 != (uchar *)0x0) {
                  operator_delete(local_200);
                }
                if (tVar1 == none_type) {
                  tlv::Tlv::Tlv((Tlv *)local_208,kScanDuration,(uint16_t)local_184,kMeshCoP);
                  AppendTlv((Error *)local_1b8,&local_b8,(Tlv *)local_208);
                  local_1e0 = local_1b8._0_4_;
                  std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_1b0);
                  tVar1 = local_1e0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_p != &local_1a0) {
                    operator_delete(local_1b0._M_p);
                  }
                  if (local_200 != (uchar *)0x0) {
                    operator_delete(local_200);
                  }
                  if (tVar1 == none_type) {
                    iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
                    if ((char)iVar2 != '\0') {
                      SignRequest((Error *)local_1b8,this,&local_b8,kMeshCoP,true);
                      local_1e0 = local_1b8._0_4_;
                      std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_1b0);
                      tVar1 = local_1e0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1b0._M_p != &local_1a0) {
                        operator_delete(local_1b0._M_p);
                      }
                      if (tVar1 != none_type) goto LAB_00166f7c;
                    }
                    std::
                    function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
                    function<ot::commissioner::CommissionerImpl::EnergyScan(std::function<void(ot::commissioner::Error)>,unsigned_int,unsigned_char,unsigned_short,unsigned_short,std::__cxx11::string_const&)::__0&,void>
                              ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>
                                *)local_140._M_pod_data,(anon_class_32_1_d0c21527 *)&local_120);
                    ProxyClient::SendRequest
                              (&this->mProxyClient,&local_b8,(ResponseHandler *)&local_140,
                               &local_178,0xf0bf);
                    if (local_130 != (code *)0x0) {
                      (*local_130)(&local_140,&local_140,__destroy_functor);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00166f7c:
  if ((local_1e0 != none_type) || ((local_b8.mHeader._0_1_ & 0xc) == 4)) {
    local_e0._0_4_ = local_1e0;
    local_d8._M_p = local_c8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_1d8,local_1d8 + local_1d0);
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      uVar4 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar4);
    }
    (*aHandler->_M_invoker)((_Any_data *)aHandler,(Error *)local_e0);
    if (local_d8._M_p != local_c8) {
      operator_delete(local_d8._M_p);
    }
  }
  if (local_110 != (code *)0x0) {
    (*local_110)(&local_120,&local_120,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  if (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  return;
}

Assistant:

void CommissionerImpl::EnergyScan(ErrorHandler       aHandler,
                                  uint32_t           aChannelMask,
                                  uint8_t            aCount,
                                  uint16_t           aPeriod,
                                  uint16_t           aScanDuration,
                                  const std::string &aDstAddr)
{
    Error         error;
    Address       dstAddr;
    ByteArray     channelMask;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error error;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

    exit:
        aHandler(error);
    };

    SuccessOrExit(error = dstAddr.Set(aDstAddr));

    if (dstAddr.IsMulticast())
    {
        request.SetType(coap::Type::kNonConfirmable);
    }

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kMgmtEdScan));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = MakeChannelMask(channelMask, aChannelMask));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kChannelMask, channelMask}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCount, aCount}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kPeriod, aPeriod}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kScanDuration, aScanDuration}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);

exit:
    if (error != ErrorCode::kNone || request.IsNonConfirmable())
    {
        aHandler(error);
    }
}